

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

bool ft::operator==(list<int,_ft::allocator<int>_> *lhs,list<int,_ft::allocator<int>_> *rhs)

{
  listNode<int> *plVar1;
  listNode<int> *plVar2;
  listNode<int> *plVar3;
  bool bVar4;
  
  if (lhs->m_size != rhs->m_size) {
    return false;
  }
  plVar1 = lhs->m_tail;
  plVar2 = lhs->m_head->next;
  bVar4 = plVar2 == plVar1;
  if (!bVar4) {
    for (plVar3 = rhs->m_head->next; plVar2->data == plVar3->data; plVar3 = plVar3->next) {
      plVar2 = plVar2->next;
      if (plVar2 == plVar1) {
        return plVar2 == plVar1;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

size_type	size() const { return this->m_size; }